

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void kj::anon_unknown_30::setNonblocking(int fd)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_30;
  Fault f;
  SyscallResult local_14;
  undefined4 local_10;
  SyscallResult _kjSyscallResult;
  int opt;
  int fd_local;
  
  local_10 = 1;
  f.exception = (Exception *)&_kjSyscallResult;
  _kjSyscallResult.errorNumber = fd;
  local_14 = _::Debug::syscall<kj::(anonymous_namespace)::setNonblocking(int)::__0>
                       ((anon_class_16_2_74ab7000 *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_14);
  if (pvVar1 != (void *)0x0) {
    return;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_14);
  _::Debug::Fault::Fault
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x3d,osErrorNumber,"ioctl(fd, FIONBIO, &opt)","");
  _::Debug::Fault::fatal(&local_30);
}

Assistant:

void setNonblocking(int fd) {
#ifdef FIONBIO
  int opt = 1;
  KJ_SYSCALL(ioctl(fd, FIONBIO, &opt));
#else
  int flags;
  KJ_SYSCALL(flags = fcntl(fd, F_GETFL));
  if ((flags & O_NONBLOCK) == 0) {
    KJ_SYSCALL(fcntl(fd, F_SETFL, flags | O_NONBLOCK));
  }
#endif
}